

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int int32_decode(cram_fd *fd,int32_t *val)

{
  hFILE *fp;
  char *__src;
  int iVar1;
  size_t __n;
  ulong uVar2;
  int32_t i;
  int32_t local_2c;
  
  fp = fd->fp;
  __src = fp->begin;
  uVar2 = (long)fp->end - (long)__src;
  __n = 4;
  if (uVar2 < 4) {
    __n = uVar2;
  }
  memcpy(&local_2c,__src,__n);
  fp->begin = __src + __n;
  if (uVar2 < 4) {
    __n = hread2(fp,&local_2c,4,__n);
  }
  iVar1 = -1;
  if (__n == 4) {
    *val = local_2c;
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

int int32_decode(cram_fd *fd, int32_t *val) {
    int32_t i;
    if (4 != hread(fd->fp, &i, 4))
	return -1;

    *val = le_int4(i);
    return 4;
}